

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

void __thiscall
bpwriter::format_with_padding(bpwriter *this,char *str,size_t bytes,size_t chars,fmtopts *opts)

{
  int cnt;
  
  cnt = opts->width - (int)chars;
  if (cnt == 0 || opts->width < (int)chars) {
    cnt = 0;
  }
  if (opts->left_align == 0) {
    putwch(this,opts->pad,cnt);
  }
  puts(this,str);
  if (opts->left_align != 0) {
    putwch(this,opts->pad,cnt);
    return;
  }
  return;
}

Assistant:

void format_with_padding(VMG_ const char *str,
                             size_t bytes, size_t chars,
                             const fmtopts &opts)
    {
        /* 
         *   Figure the amount of padding: if the width is larger than the
         *   string length (in characters), pad by the difference.  
         */
        int npad = (opts.width > (int)chars ? opts.width - chars : 0);

        /* if right-aligning, write the padding */
        if (!opts.left_align)
            putwch(opts.pad, npad);

        /* write the string */
        puts(str, bytes);

        /* if left-aligning, write the padding */
        if (opts.left_align)
            putwch(opts.pad, npad);
    }